

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O3

idx_t __thiscall duckdb::RadixHTConfig::MaximumSinkRadixBits(RadixHTConfig *this)

{
  uint64_t uVar1;
  idx_t iVar2;
  ulong uVar3;
  
  if (2 < this->number_of_threads) {
    iVar2 = 6;
    if (this->row_width < 0x40) {
      iVar2 = (ulong)(this->row_width < 0x20) + 7;
    }
    return iVar2;
  }
  uVar1 = NextPowerOfTwo(this->number_of_threads);
  if (uVar1 == 0) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar3 = uVar1 >> 1 | uVar1;
    uVar3 = uVar3 >> 2 | uVar3;
    uVar3 = uVar3 >> 4 | uVar3;
    uVar3 = uVar3 >> 8 | uVar3;
    uVar3 = uVar3 >> 0x10 | uVar3;
    uVar3 = *(ulong *)(&DAT_0133fae0 + ((uVar3 >> 0x20 | uVar3) * 0x3f79d71b4cb0a89 >> 0x3a) * 8);
  }
  iVar2 = 4;
  if (uVar3 < 4) {
    iVar2 = uVar3;
  }
  return iVar2;
}

Assistant:

idx_t RadixHTConfig::MaximumSinkRadixBits() const {
	if (number_of_threads <= GROW_STRATEGY_THREAD_THRESHOLD) {
		return InitialSinkRadixBits(); // Don't repartition unless we go external
	}
	// If rows are very wide we have to reduce the number of partitions, otherwise cache misses get out of hand
	if (row_width >= ROW_WIDTH_THRESHOLD_TWO) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 2;
	}
	if (row_width >= ROW_WIDTH_THRESHOLD_ONE) {
		return MAXIMUM_FINAL_SINK_RADIX_BITS - 1;
	}
	return MAXIMUM_FINAL_SINK_RADIX_BITS;
}